

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::loadFreqMap(char *fname,TFreqMap *res,double pmin)

{
  mapped_type mVar1;
  long lVar2;
  type_conflict2 tVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  istream *this;
  mapped_type *pmVar9;
  undefined8 uVar10;
  size_type sVar11;
  size_type sVar12;
  mapped_type *pmVar13;
  int *in_RSI;
  char *in_RDI;
  float fVar14;
  double in_XMM0_Qa;
  double dVar15;
  rep tDiff_1;
  time_point tEnd_1;
  double pp;
  type_conflict2 *p_2;
  type *i_4;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  *__range2_2;
  time_point tStart_1;
  rep tDiff;
  time_point tEnd;
  type_conflict2 *p_1;
  type *i_3;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  *__range2_1;
  int *mask_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  type *p;
  type *i_2;
  iterator __end2;
  iterator __begin2;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  *__range2;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  pwild;
  int i_1;
  int i;
  int32_t mm;
  int32_t l;
  value_type *mask;
  int m;
  vector<int,_std::allocator<int>_> masks;
  time_point tStart;
  TCode idx;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  pi64;
  int64_t nfreq;
  string gram;
  ifstream fin;
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *prob;
  TGramLen *len;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  *in_stack_fffffffffffffb00;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffb08;
  allocator_type *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb20;
  duration<long,_std::ratio<1L,_1000L>_> local_430;
  rep local_428;
  undefined8 local_420;
  double local_418;
  type_conflict2 *local_410;
  uint *local_408;
  reference local_400;
  _Node_iterator_base<std::pair<const_int,_long>,_false> local_3f8;
  _Node_iterator_base<std::pair<const_int,_long>,_false> local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  rep local_3d8;
  duration<long,_std::ratio<1L,_1000L>_> local_3d0;
  rep local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b4;
  type_conflict2 *local_3b0;
  type *local_3a8;
  reference local_3a0;
  _Node_iterator_base<std::pair<const_int,_long>,_false> local_398;
  _Node_iterator_base<std::pair<const_int,_long>,_false> local_390;
  undefined1 *local_388;
  uint local_37c;
  uint *local_378;
  int *local_370;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_368;
  vector<int,_std::allocator<int>_> *local_360;
  long *local_358;
  uint *local_350;
  reference local_348;
  _Node_iterator_base<std::pair<const_int,_long>,_false> local_340;
  _Node_iterator_base<std::pair<const_int,_long>,_false> local_338;
  undefined1 *local_330;
  undefined1 local_328 [56];
  uint local_2f0;
  int local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint *local_2e0;
  uint local_2d8;
  vector<int,_std::allocator<int>_> local_2d0;
  undefined8 local_2b8;
  TCode local_2ac;
  undefined1 local_2a8 [56];
  long local_270;
  string local_268 [32];
  int local_248;
  istream local_238 [520];
  int *local_30;
  int *local_28;
  double local_20;
  int *local_18;
  char *local_10;
  byte local_1;
  
  local_30 = in_RSI + 6;
  *in_RSI = 0;
  local_28 = in_RSI;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  ::clear((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
           *)0x1b66cf);
  printf("[+] Loading n-gram file \'%s\'\n",local_10);
  std::ifstream::ifstream(local_238,local_10,_S_in);
  bVar5 = std::ios::good();
  if ((bVar5 & 1) == 0) {
    printf("    Failed to open file\n");
    local_1 = 0;
    local_248 = 1;
  }
  else {
    std::__cxx11::string::string(local_268);
    local_270 = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    std::
    unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
    ::unordered_map((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                     *)0x1b67a9);
    while( true ) {
      this = std::operator>>(local_238,local_268);
      std::istream::operator>>(this,&local_270);
      bVar5 = std::ios::eof();
      if ((bVar5 & 1) != 0) break;
      if (*local_28 == 0) {
        iVar7 = std::__cxx11::string::size();
        *local_28 = iVar7;
      }
      else {
        iVar7 = *local_28;
        iVar8 = std::__cxx11::string::size();
        if (iVar7 != iVar8) {
          printf("Error: loaded n-grams with vaying lengths\n");
          local_1 = 0;
          local_248 = 1;
          goto LAB_001b735d;
        }
      }
      std::__cxx11::string::data();
      local_2ac = calcCode((char *)in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
      pmVar9 = std::
               unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
               ::operator[](in_stack_fffffffffffffb00,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      lVar2 = local_270;
      if (0 < *pmVar9) {
        uVar10 = std::__cxx11::string::c_str();
        printf("Error: duplicate n-gram \'%s\'\n",uVar10);
        local_1 = 0;
        local_248 = 1;
        goto LAB_001b735d;
      }
      pmVar9 = std::
               unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
               ::operator[](in_stack_fffffffffffffb00,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      *pmVar9 = lVar2;
      *(long *)(local_18 + 2) = local_270 + *(long *)(local_18 + 2);
    }
    printf("    Total n-grams loaded = %g\n",(double)*(long *)(local_18 + 2));
    local_2b8 = std::chrono::_V2::steady_clock::now();
    std::allocator<int>::allocator((allocator<int> *)0x1b69f3);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffb20,
               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               in_stack_fffffffffffffb10);
    std::allocator<int>::~allocator((allocator<int> *)0x1b6a1f);
    for (local_2d8 = 0; uVar4 = local_2d8,
        sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_2d0), (int)uVar4 < (int)sVar11;
        local_2d8 = local_2d8 + 1) {
      local_2e0 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_2d0,(long)(int)local_2d8);
      *local_2e0 = 0;
      local_2e4 = 0x1f;
      local_2e8 = local_2d8;
      for (local_2ec = 0; local_2ec < *local_28; local_2ec = local_2ec + 1) {
        if ((local_2e8 & 1) != 0) {
          *local_2e0 = local_2e4 | *local_2e0;
        }
        local_2e8 = (int)local_2e8 >> 1;
        local_2e4 = local_2e4 << 5;
      }
      printf("    Mask %2d: ",(ulong)local_2d8);
      for (local_2f0 = 0; SBORROW4(local_2f0,*local_28 * 5) != (int)(local_2f0 + *local_28 * -5) < 0
          ; local_2f0 = local_2f0 + 1) {
        printf("%d",(ulong)((*local_2e0 >> (~local_2f0 + *local_28 * 5 & 0x1f) & 1) != 0));
      }
      printf("\n");
    }
    std::
    unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
    ::unordered_map((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                     *)0x1b6c16);
    local_330 = local_2a8;
    local_338._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
         ::begin((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    local_340._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
         ::end((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    while (bVar6 = std::__detail::operator!=(&local_338,&local_340), bVar6) {
      local_348 = std::__detail::_Node_iterator<std::pair<const_int,_long>,_false,_false>::operator*
                            ((_Node_iterator<std::pair<const_int,_long>,_false,_false> *)0x1b6c7b);
      local_350 = (uint *)std::get<0ul,int_const,long>((pair<const_int,_long> *)0x1b6c90);
      local_358 = std::get<1ul,int_const,long>((pair<const_int,_long> *)0x1b6ca5);
      if (*local_358 == 0) {
        printf("i = %d, p == 0 - should not happen\n",(ulong)*local_350);
        local_1 = 0;
        local_248 = 1;
        goto LAB_001b6f30;
      }
      local_360 = &local_2d0;
      local_368._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      local_370 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      while (bVar6 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffb00,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8)),
            bVar6) {
        local_378 = (uint *)__gnu_cxx::
                            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                            operator*(&local_368);
        lVar2 = *local_358;
        local_37c = *local_350 & *local_378;
        pmVar9 = std::
                 unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                 ::operator[](in_stack_fffffffffffffb00,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        *pmVar9 = lVar2 + *pmVar9;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_368);
      }
      std::__detail::_Node_iterator<std::pair<const_int,_long>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_int,_long>,_false,_false> *)
                 in_stack_fffffffffffffb00);
    }
    sVar12 = std::
             unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
             ::size((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                     *)0x1b6e12);
    printf("Size of pwild = %d\n",sVar12 & 0xffffffff);
    local_388 = local_328;
    local_390._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
         ::begin((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    local_398._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
         ::end((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    while (bVar6 = std::__detail::operator!=(&local_390,&local_398), bVar6) {
      local_3a0 = std::__detail::_Node_iterator<std::pair<const_int,_long>,_false,_false>::operator*
                            ((_Node_iterator<std::pair<const_int,_long>,_false,_false> *)0x1b6e89);
      local_3a8 = std::get<0ul,int_const,long>((pair<const_int,_long> *)0x1b6e9e);
      local_3b0 = std::get<1ul,int_const,long>((pair<const_int,_long> *)0x1b6eb3);
      tVar3 = *local_3b0;
      pmVar9 = std::
               unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
               ::operator[](in_stack_fffffffffffffb00,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      *pmVar9 = tVar3;
      std::__detail::_Node_iterator<std::pair<const_int,_long>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_int,_long>,_false,_false> *)
                 in_stack_fffffffffffffb00);
    }
    sVar12 = std::
             unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
             ::size((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                     *)0x1b6f13);
    printf("Size of pi64 = %d\n",sVar12 & 0xffffffff);
    local_248 = 0;
LAB_001b6f30:
    std::
    unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
    ::~unordered_map((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                      *)0x1b6f3d);
    if (local_248 == 0) {
      local_3b4 = 0;
      pmVar9 = std::
               unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
               ::operator[](in_stack_fffffffffffffb00,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      if (*pmVar9 == *(long *)(local_18 + 2)) {
        local_3c0 = std::chrono::_V2::steady_clock::now();
        local_3d8 = (rep)std::chrono::operator-
                                   (in_stack_fffffffffffffb08,
                                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)in_stack_fffffffffffffb00);
        local_3d0.__r =
             (rep)std::chrono::
                  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                             CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        local_3c8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_3d0);
        printf("    Wildcard probabilities computed in %g ms\n",(double)local_3c8);
        local_248 = 0;
      }
      else {
        local_3b8 = 0;
        pmVar9 = std::
                 unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                 ::operator[](in_stack_fffffffffffffb00,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n",*pmVar9,
               *(undefined8 *)(local_18 + 2));
        local_1 = 0;
        local_248 = 1;
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10);
    if (local_248 == 0) {
      local_3e0 = std::chrono::_V2::steady_clock::now();
      dVar15 = log10(local_20);
      local_18[4] = (int)(float)dVar15;
      printf("    P-min = %g\n",(double)(float)local_18[4]);
      local_3e8 = local_2a8;
      local_3f0._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
           ::begin((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                    *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      local_3f8._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
           ::end((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      while (bVar6 = std::__detail::operator!=(&local_3f0,&local_3f8), bVar6) {
        local_400 = std::__detail::_Node_iterator<std::pair<const_int,_long>,_false,_false>::
                    operator*((_Node_iterator<std::pair<const_int,_long>,_false,_false> *)0x1b715b);
        local_408 = (uint *)std::get<0ul,int_const,long>((pair<const_int,_long> *)0x1b7170);
        local_410 = std::get<1ul,int_const,long>((pair<const_int,_long> *)0x1b7185);
        if (*local_410 == 0) {
          printf("i = %d, p == 0 - should not happen\n",(ulong)*local_408);
          local_1 = 0;
          local_248 = 1;
          goto LAB_001b735d;
        }
        local_418 = (double)*local_410 / (double)*(long *)(local_18 + 2);
        if (local_20 <= local_418) {
          dVar15 = log10(local_418);
          fVar14 = (float)dVar15;
          pmVar13 = std::
                    unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                    ::operator[]((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                  *)in_stack_fffffffffffffb00,
                                 (key_type *)
                                 CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          *pmVar13 = fVar14;
        }
        else {
          mVar1 = (mapped_type)local_18[4];
          pmVar13 = std::
                    unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                    ::operator[]((unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                  *)in_stack_fffffffffffffb00,
                                 (key_type *)
                                 CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          *pmVar13 = mVar1;
        }
        std::__detail::_Node_iterator<std::pair<const_int,_long>,_false,_false>::operator++
                  ((_Node_iterator<std::pair<const_int,_long>,_false,_false> *)
                   in_stack_fffffffffffffb00);
      }
      local_420 = std::chrono::_V2::steady_clock::now();
      std::chrono::operator-
                (in_stack_fffffffffffffb08,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_fffffffffffffb00);
      local_430.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      local_428 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_430);
      printf("    Probability computation time = %g ms\n",(double)local_428);
      local_1 = 1;
      local_248 = 1;
    }
LAB_001b735d:
    std::
    unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
    ::~unordered_map((unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
                      *)0x1b736a);
    std::__cxx11::string::~string(local_268);
  }
  std::ifstream::~ifstream(local_238);
  return (bool)(local_1 & 1);
}

Assistant:

bool loadFreqMap(const char * fname, TFreqMap & res, double pmin) {
        auto & len = res.len;
        auto & prob = res.prob;

        len = 0;
        prob.clear();

        printf("[+] Loading n-gram file '%s'\n", fname);
        std::ifstream fin(fname);

        if (fin.good() == false) {
            printf("    Failed to open file\n");
            return false;
        }

        std::string gram;
        int64_t nfreq = 0;
        res.nTotal = 0;

        std::unordered_map<TCode, int64_t> pi64;

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            if (len == 0) {
                len = gram.size();
            } else if (len != (int) gram.size()) {
                printf("Error: loaded n-grams with vaying lengths\n");
                return false;
            }

            TCode idx = calcCode(gram.data(), len);
            if (pi64[idx] > 0) {
                printf("Error: duplicate n-gram '%s'\n", gram.c_str());
                return false;
            }
            pi64[idx] = nfreq;
            res.nTotal += nfreq;
        }
        printf("    Total n-grams loaded = %g\n", (double) res.nTotal);

        // compute wildcard frequencies
        {
            const auto tStart = std::chrono::steady_clock::now();

            std::vector<int32_t> masks((1 << len) - 1);
            for (int m = 0; m < (int) masks.size(); ++m) {
                auto & mask = masks[m];

                mask = 0;
                int32_t l = 0b11111;
                int32_t mm = m;
                for (int i = 0; i < len; ++i) {
                    if (mm & 1) {
                        mask |= l;
                    }
                    mm >>= 1;
                    l <<= 5;
                }

                // print mask in binary
                printf("    Mask %2d: ", m);
                for (int i = 0; i < 5*len; ++i) {
                    printf("%d", (mask >> (5*len - 1 - i)) & 1);
                }
                printf("\n");
            }

            {
                std::unordered_map<TCode, int64_t> pwild;
                for (const auto & [i, p] : pi64) {
                    if (p == 0) {
                        printf("i = %d, p == 0 - should not happen\n", i);
                        return false;
                    }

                    for (const auto & mask : masks) {
                        pwild[i & mask] += p;
                    }
                }

                printf("Size of pwild = %d\n", (int) pwild.size());

                for (auto & [i, p] : pwild) {
                    pi64[i] = p;
                }

                printf("Size of pi64 = %d\n", (int) pi64.size());
            }

            if (pi64[0] != res.nTotal) {
                printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n", (long) pi64[0], (long) res.nTotal);
                return false;
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Wildcard probabilities computed in %g ms\n", (double) tDiff);
        }

        // compute probabilities
        {
            const auto tStart = std::chrono::steady_clock::now();

            res.pmin = std::log10(pmin);
            printf("    P-min = %g\n", res.pmin);

            for (auto & [i, p] : pi64) {
                if (p == 0) {
                    printf("i = %d, p == 0 - should not happen\n", i);
                    return false;
                } else {
                    double pp = double(p)/res.nTotal;
                    if (pp < pmin) {
                        prob[i] = res.pmin;
                    } else {
                        prob[i] = std::log10(pp);
                    }
                }
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Probability computation time = %g ms\n", (double) tDiff);
        }

        return true;
    }